

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  int local_1c;
  int rc;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  local_1c = 0;
  if ((pTo->flags & 0x2460) != 0) {
    sqlite3VdbeMemReleaseExternal(pTo);
  }
  memcpy(pTo,pFrom,0x30);
  pTo->flags = pTo->flags & 0xfbff;
  if (((pTo->flags & 0x12) != 0) && ((pFrom->flags & 0x800) == 0)) {
    pTo->flags = pTo->flags | 0x1000;
    local_1c = sqlite3VdbeMemMakeWriteable(pTo);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( (pFrom->flags & MEM_RowSet)==0 );
  VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;

  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}